

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Spacer::Spacer(Spacer *this,size_t spaceWidth)

{
  size_t in_RSI;
  Column *in_RDI;
  string *in_stack_ffffffffffffffb8;
  Column *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [32];
  size_t local_10;
  
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"",&local_31);
  Column::Column(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Column::width(in_RDI,local_10);
  return;
}

Assistant:

explicit Spacer(size_t spaceWidth) : Column("") {
		width(spaceWidth);
	}